

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::UFFAdapter::makeUFF
          (UFFAdapter *this,RealType r1,RealType theta0,RealType x1,RealType D1,RealType zeta,
          RealType Z1,RealType Vi,RealType Uj,RealType Xi,RealType Hard,RealType Radius)

{
  bool bVar1;
  undefined8 *in_RDI;
  shared_ptr<OpenMD::GenericData> *in_XMM6_Qa;
  AtomType *in_XMM7_Qa;
  UFFAtypeParameters uffParam;
  string *in_stack_ffffffffffffff08;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> *__r;
  AtomType *in_stack_ffffffffffffff10;
  shared_ptr<OpenMD::GenericData> *this_00;
  UFFAtypeParameters *in_stack_ffffffffffffff30;
  element_type *in_stack_ffffffffffffff38;
  
  bVar1 = isUFF((UFFAdapter *)0x397a87);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  this_00 = (shared_ptr<OpenMD::GenericData> *)*in_RDI;
  __r = (shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> *)&stack0xffffffffffffff38;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,std::__cxx11::string_const&,OpenMD::UFFAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>,void>(this_00,__r);
  AtomType::addProperty(in_XMM7_Qa,in_XMM6_Qa);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x397bd8);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::UFFAtypeParameters>_> *)0x397be2);
  return;
}

Assistant:

void UFFAdapter::makeUFF(RealType r1, RealType theta0, RealType x1,
                           RealType D1, RealType zeta, RealType Z1, RealType Vi,
                           RealType Uj, RealType Xi, RealType Hard,
                           RealType Radius) {
    if (isUFF()) { at_->removeProperty(UFFtypeID); }

    UFFAtypeParameters uffParam {};

    uffParam.r1     = r1;
    uffParam.theta0 = theta0;
    uffParam.x1     = x1;
    uffParam.D1     = D1;
    uffParam.zeta   = zeta;
    uffParam.Z1     = Z1;
    uffParam.Vi     = Vi;
    uffParam.Uj     = Uj;
    uffParam.Xi     = Xi;
    uffParam.Hard   = Hard;
    uffParam.Radius = Radius;
    at_->addProperty(std::make_shared<UFFAtypeData>(UFFtypeID, uffParam));
  }